

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

void __thiscall duckdb_re2::DFA::RWLocker::~RWLocker(RWLocker *this)

{
  if (this->writing_ == false) {
    Mutex::ReaderUnlock(this->mu_);
  }
  else {
    Mutex::Unlock(this->mu_);
  }
  return;
}

Assistant:

DFA::RWLocker::~RWLocker() {
  if (!writing_)
    mu_->ReaderUnlock();
  else
    mu_->WriterUnlock();
}